

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall Liby::ExitCaller::callImp(ExitCaller *this,function<void_()> *functor)

{
  std::mutex::lock(&ExitCallerMutex);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&ExitCallerFunctors_abi_cxx11_,functor);
  pthread_mutex_unlock((pthread_mutex_t *)&ExitCallerMutex);
  return;
}

Assistant:

void ExitCaller::callImp(const std::function<void()> &functor) {
    std::lock_guard<std::mutex> G_(ExitCallerMutex);
    ExitCallerFunctors.push_back(functor);
}